

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O3

INT Internal_AddPaddingVfprintf
              (CPalThread *pthrCurrent,PAL_FILE *stream,LPSTR In,INT Padding,INT Flags)

{
  int iVar1;
  errno_t eVar2;
  size_t sVar3;
  char *_Dst;
  int *piVar4;
  size_t sVar5;
  char *_Dst_00;
  int iVar6;
  INT IVar7;
  int iVar8;
  
  sVar3 = strlen(In);
  iVar8 = 0;
  if (0 < Padding) {
    iVar8 = Padding;
  }
  iVar1 = (int)sVar3;
  iVar6 = iVar8 + iVar1 + 1;
  _Dst = (char *)CorUnix::InternalMalloc((long)iVar6);
  if (_Dst == (char *)0x0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar4 = __errno_location();
      *piVar4 = 8;
      return -1;
    }
    goto LAB_0011ac52;
  }
  _Dst_00 = _Dst;
  if ((Flags & 1U) == 0) {
LAB_0011ab97:
    if (0 < Padding) {
      iVar6 = iVar6 - Padding;
      if ((Flags & 4U) == 0) {
        do {
          *_Dst_00 = ' ';
          _Dst_00 = _Dst_00 + 1;
          Padding = Padding + -1;
        } while (Padding != 0);
      }
      else {
        do {
          *_Dst_00 = '0';
          _Dst_00 = _Dst_00 + 1;
          Padding = Padding + -1;
        } while (Padding != 0);
      }
    }
    if (((Flags & 1U) != 0) || (eVar2 = strcpy_s(_Dst_00,(long)iVar6,In), eVar2 == 0)) {
      sVar5 = CorUnix::InternalFwrite
                        (_Dst,1,(long)(iVar8 + iVar1),stream->bsdFilePtr,&stream->PALferrorCode);
      IVar7 = (INT)sVar5;
      if ((stream->PALferrorCode == 1) && (PAL_InitializeChakraCoreCalled == false))
      goto LAB_0011ac52;
      goto LAB_0011ac38;
    }
  }
  else {
    eVar2 = strcpy_s(_Dst,(long)iVar6,In);
    if (eVar2 == 0) {
      _Dst_00 = _Dst + iVar1;
      iVar6 = iVar6 - iVar1;
      goto LAB_0011ab97;
    }
  }
  if (PAL_InitializeChakraCoreCalled == false) {
LAB_0011ac52:
    abort();
  }
  piVar4 = __errno_location();
  *piVar4 = 0x7a;
  IVar7 = -1;
LAB_0011ac38:
  CorUnix::InternalFree(_Dst);
  return IVar7;
}

Assistant:

INT Internal_AddPaddingVfprintf(CPalThread *pthrCurrent, PAL_FILE *stream, LPSTR In,
                                       INT Padding, INT Flags)
{
    LPSTR Out;
    INT LengthInStr;
    INT Length;
    LPSTR OutOriginal;
    INT Written;

    LengthInStr = strlen(In);
    Length = LengthInStr;

    if (Padding > 0)
    {
        Length += Padding;
    }
    Out = (LPSTR) InternalMalloc(Length+1);
    int iLength = Length+1;
    if (!Out)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return -1;
    }
    OutOriginal = Out;

    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (strcpy_s(Out, iLength, In) != SAFECRT_SUCCESS)
        {
            ERROR("strcpy_s failed\n");
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLength -= LengthInStr;
    }
    if (Padding > 0)
    {
        iLength -= Padding;
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding--)
            {
                *Out++ = '0';
            }
        }
        else /* pad with spaces */
        {
            while (Padding--)
            {
                *Out++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (strcpy_s(Out, iLength, In) != SAFECRT_SUCCESS)
        {
            ERROR("strcpy_s failed\n");
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLength -= LengthInStr;
    }

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr (stream->bsdFilePtr);
#endif

    Written = InternalFwrite(OutOriginal, 1, Length, stream->bsdFilePtr, &stream->PALferrorCode);
    if (stream->PALferrorCode == PAL_FILE_ERROR)
    {
        ERROR("fwrite() failed with errno == %d\n", errno);
    }

Done:
    InternalFree(OutOriginal);

    return Written;
}